

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O2

intptr_t mock_(TestReporter *test_reporter,char *function,char *mock_file,int mock_line,
              char *parameters,...)

{
  char cVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  void *__src;
  size_t __size;
  CgreenValue value;
  CgreenValue CVar4;
  CgreenValue CVar5;
  char in_AL;
  _Bool _Var6;
  int iVar7;
  int iVar8;
  int iVar9;
  RecordedExpectation *pRVar10;
  CgreenVector *vector;
  char *pcVar11;
  CgreenVector *vector_00;
  intptr_t *piVar12;
  CgreenValue *item;
  CgreenVector *pCVar13;
  undefined4 *puVar14;
  char *pcVar15;
  int *piVar16;
  char *__s1;
  Constraint *pCVar17;
  undefined1 (*pauVar18) [16];
  void *__dest;
  ulong uVar19;
  int i;
  int iVar20;
  int i_1;
  undefined8 in_R9;
  bool bVar21;
  undefined8 in_XMM0_Qa;
  double dVar22;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_158 [16];
  size_t local_148;
  char *local_138;
  char *local_130;
  va_list actuals;
  CgreenValue actual;
  undefined1 local_e8 [40];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  iVar20 = 0;
  local_138 = function;
  local_130 = mock_file;
  local_c0 = in_R9;
  do {
    iVar7 = cgreen_vector_size(global_expectation_queue);
    pRVar10 = (RecordedExpectation *)0x0;
    if (iVar7 <= iVar20) break;
    pRVar10 = (RecordedExpectation *)cgreen_vector_get(global_expectation_queue,iVar20);
    iVar7 = strcmp(pRVar10->function,function);
    iVar20 = iVar20 + 1;
  } while (iVar7 != 0);
  vector = create_vector_of_names(parameters);
  actuals[0].gp_offset = 0x28;
  actuals[0].fp_offset = 0x30;
  actuals[0].overflow_arg_area = &stack0x00000008;
  actuals[0].reg_save_area = local_e8;
  cVar1 = *parameters;
  iVar20 = 0;
  if (cVar1 != '\0') {
    iVar20 = 1;
    pcVar11 = parameters;
    do {
      pcVar11 = pcVar11 + 1;
      if (cVar1 == ',') {
        iVar20 = iVar20 + 1;
      }
      else if (cVar1 == '\0') break;
      cVar1 = *pcVar11;
    } while( true );
  }
  vector_00 = create_cgreen_vector(free);
  iVar7 = 0;
  if (0 < iVar20) {
    iVar7 = iVar20;
  }
  while (bVar21 = iVar7 != 0, iVar7 = iVar7 + -1, bVar21) {
    uVar19 = actuals[0]._0_8_ & 0xffffffff;
    if (uVar19 < 0x29) {
      actuals[0].gp_offset = actuals[0].gp_offset + 8;
      piVar12 = (intptr_t *)(uVar19 + (long)actuals[0].reg_save_area);
    }
    else {
      piVar12 = (intptr_t *)actuals[0].overflow_arg_area;
      actuals[0].overflow_arg_area = (void *)((long)actuals[0].overflow_arg_area + 8);
    }
    make_cgreen_integer_value((CgreenValue *)local_158,*piVar12);
    value.value_size = local_148;
    value.type = local_158._0_4_;
    value._4_4_ = local_158._4_4_;
    value.value = (anon_union_8_4_d526cc82_for_value)local_158._8_8_;
    item = create_cgreen_value(value);
    cgreen_vector_add(vector_00,item);
  }
  pCVar13 = create_vector_of_double_markers_for(parameters);
  for (iVar20 = 0; iVar7 = cgreen_vector_size(pCVar13), iVar20 < iVar7; iVar20 = iVar20 + 1) {
    pcVar11 = (char *)cgreen_vector_get(pCVar13,iVar20);
    if (*pcVar11 == '\x01') {
      puVar14 = (undefined4 *)cgreen_vector_get(vector_00,iVar20);
      uVar2 = puVar14[1];
      uVar3 = *(undefined8 *)(puVar14 + 4);
      dVar22 = unbox_double(*(intptr_t *)(puVar14 + 2));
      *puVar14 = 2;
      puVar14[1] = uVar2;
      *(double *)(puVar14 + 2) = dVar22;
      *(undefined8 *)(puVar14 + 4) = uVar3;
    }
  }
  destroy_cgreen_vector(pCVar13);
  pcVar11 = local_138;
  if (pRVar10 == (RecordedExpectation *)0x0) {
    if (cgreen_mocks_are_ == strict_mocks) {
      pCVar13 = create_constraints_vector();
      pRVar10 = create_recorded_expectation(pcVar11,local_130,mock_line,pCVar13);
      pcVar11 = pRVar10->function;
      iVar20 = 0;
      pcVar15 = "Mocked function [%s] did not have an expectation that it would be called";
      do {
        iVar7 = cgreen_vector_size(successfully_mocked_calls);
        if (iVar7 <= iVar20) goto LAB_00109e57;
        __s1 = (char *)cgreen_vector_get(successfully_mocked_calls,iVar20);
        iVar7 = strcmp(__s1,pcVar11);
        iVar20 = iVar20 + 1;
      } while (iVar7 != 0);
      pcVar15 = "Mocked function [%s] was called too many times";
LAB_00109e57:
      (*test_reporter->assert_true)
                (test_reporter,current_test->filename,current_test->line,0,pcVar15,pcVar11);
      destroy_expectation(pRVar10);
    }
    else if (cgreen_mocks_are_ == learning_mocks) {
      pCVar13 = create_constraints_vector();
      for (iVar20 = 0; iVar7 = cgreen_vector_size(vector), iVar20 < iVar7; iVar20 = iVar20 + 1) {
        pcVar15 = (char *)cgreen_vector_get(vector,iVar20);
        piVar16 = (int *)cgreen_vector_get(vector_00,iVar20);
        if (*piVar16 == 2) {
          pCVar17 = create_equal_to_double_constraint(*(double *)(piVar16 + 2),pcVar15);
        }
        else {
          pCVar17 = create_equal_to_value_constraint((intptr_t)*(double *)(piVar16 + 2),pcVar15);
        }
        cgreen_vector_add(pCVar13,pCVar17);
      }
      pRVar10 = create_recorded_expectation(pcVar11,local_130,mock_line,pCVar13);
      if (learned_mock_calls == (CgreenVector *)0x0) {
        learned_mock_calls = create_cgreen_vector((_func_void_void_ptr *)0x0);
      }
      cgreen_vector_add(learned_mock_calls,pRVar10);
    }
    destroy_cgreen_vector(vector_00);
    destroy_cgreen_vector(vector);
    __dest = (void *)0x0;
  }
  else if (pRVar10->time_to_live == -0xf314159) {
    pRVar10->times_triggered = pRVar10->times_triggered + 1;
    __dest = (void *)0x0;
    (*test_reporter->assert_true)
              (test_reporter,pRVar10->test_file,pRVar10->test_line,0,
               "Mocked function [%s] has an expectation that it will never be called, but it was",
               pRVar10->function);
    destroy_cgreen_vector(vector_00);
LAB_00109caa:
    destroy_cgreen_vector(vector);
  }
  else {
    if (successfully_mocked_calls == (CgreenVector *)0x0) {
      successfully_mocked_calls = create_cgreen_vector((_func_void_void_ptr *)0x0);
    }
    cgreen_vector_add(successfully_mocked_calls,pcVar11);
    pCVar13 = pRVar10->constraints;
    for (iVar20 = 0; iVar7 = cgreen_vector_size(pCVar13), iVar20 < iVar7; iVar20 = iVar20 + 1) {
      piVar16 = (int *)cgreen_vector_get(pCVar13,iVar20);
      iVar7 = *piVar16;
      if (iVar7 == 4) {
LAB_00109d9c:
        iVar20 = piVar16[0x10];
        __dest = *(void **)(piVar16 + 0x12);
        goto LAB_00109ed6;
      }
      if (iVar7 == 9) {
        iVar20 = piVar16[0x10];
        __src = *(void **)(piVar16 + 0x12);
        __size = *(size_t *)(piVar16 + 0x14);
        __dest = malloc(__size);
        memcpy(__dest,__src,__size);
        goto LAB_00109ed6;
      }
      if (iVar7 == 6) goto LAB_00109d9c;
    }
    iVar20 = 0;
    __dest = (void *)0x0;
LAB_00109ed6:
    for (iVar7 = 0; iVar8 = cgreen_vector_size(pRVar10->constraints), iVar7 < iVar8;
        iVar7 = iVar7 + 1) {
      pCVar17 = (Constraint *)cgreen_vector_get(pRVar10->constraints,iVar7);
      if (pCVar17->type == CGREEN_CALL_COUNTER_CONSTRAINT) {
        pRVar10->number_times_called = pRVar10->number_times_called + 1;
      }
      else {
        _Var6 = is_parameter(pCVar17);
        if ((_Var6) && (_Var6 = constraint_is_for_parameter_in(pCVar17,parameters), !_Var6)) {
          (*test_reporter->assert_true)
                    (test_reporter,pRVar10->test_file,pRVar10->test_line,0,
                     "Mocked function [%s] did not define a parameter named [%s]. Did you misspell it in the expectation or forget it in the mock\'s argument list?"
                     ,pRVar10->function,pCVar17->parameter_name);
          destroy_expectation_if_time_to_die(pRVar10);
          destroy_cgreen_vector(vector_00);
          goto LAB_00109caa;
        }
      }
    }
    local_138 = (char *)CONCAT44(local_138._4_4_,test_reporter->failures);
    for (iVar7 = 0; iVar8 = cgreen_vector_size(vector), iVar7 < iVar8; iVar7 = iVar7 + 1) {
      pcVar11 = (char *)cgreen_vector_get(vector,iVar7);
      pauVar18 = (undefined1 (*) [16])cgreen_vector_get(vector_00,iVar7);
      local_158 = *pauVar18;
      local_148 = *(size_t *)pauVar18[1];
      for (iVar8 = 0; iVar9 = cgreen_vector_size(pRVar10->constraints), iVar8 < iVar9;
          iVar8 = iVar8 + 1) {
        pCVar17 = (Constraint *)cgreen_vector_get(pRVar10->constraints,iVar8);
        _Var6 = is_content_setting(pCVar17);
        if (((!_Var6) && (pCVar17->type != CGREEN_CALL_CONSTRAINT)) &&
           (_Var6 = constraint_is_not_for_parameter(pCVar17,pcVar11), !_Var6)) {
          CVar4.value_size = local_148;
          CVar4.type = local_158._0_4_;
          CVar4._4_4_ = local_158._4_4_;
          CVar4.value = (anon_union_8_4_d526cc82_for_value)local_158._8_8_;
          (*pCVar17->execute)(pCVar17,pRVar10->function,CVar4,pRVar10->test_file,pRVar10->test_line,
                              test_reporter);
        }
      }
    }
    if ((int)local_138 == test_reporter->failures) {
      for (iVar7 = 0; iVar8 = cgreen_vector_size(vector), iVar7 < iVar8; iVar7 = iVar7 + 1) {
        pcVar11 = (char *)cgreen_vector_get(vector,iVar7);
        pauVar18 = (undefined1 (*) [16])cgreen_vector_get(vector_00,iVar7);
        local_158 = *pauVar18;
        local_148 = *(size_t *)pauVar18[1];
        for (iVar8 = 0; iVar9 = cgreen_vector_size(pRVar10->constraints), iVar8 < iVar9;
            iVar8 = iVar8 + 1) {
          pCVar17 = (Constraint *)cgreen_vector_get(pRVar10->constraints,iVar8);
          _Var6 = constraint_is_not_for_parameter(pCVar17,pcVar11);
          if ((!_Var6) && (pCVar17->type == CGREEN_CONTENT_SETTER_CONSTRAINT)) {
            CVar5.value_size = local_148;
            CVar5.type = local_158._0_4_;
            CVar5._4_4_ = local_158._4_4_;
            CVar5.value = (anon_union_8_4_d526cc82_for_value)local_158._8_8_;
            (*pCVar17->execute)(pCVar17,pRVar10->function,CVar5,pRVar10->test_file,
                                pRVar10->test_line,test_reporter);
          }
        }
      }
    }
    for (iVar7 = 0; iVar8 = cgreen_vector_size(pRVar10->constraints), iVar7 < iVar8;
        iVar7 = iVar7 + 1) {
      piVar16 = (int *)cgreen_vector_get(pRVar10->constraints,iVar7);
      if (*piVar16 == 7) {
        local_148 = 0;
        local_158 = (undefined1  [16])0x0;
        (**(code **)(piVar16 + 8))
                  (piVar16,pRVar10->function,pRVar10->test_file,pRVar10->test_line,test_reporter);
      }
    }
    destroy_cgreen_vector(vector);
    destroy_cgreen_vector(vector_00);
    pRVar10->times_triggered = pRVar10->times_triggered + 1;
    destroy_expectation_if_time_to_die(pRVar10);
    if (iVar20 == 2) {
      __dest = (void *)box_double((double)__dest);
    }
  }
  return (intptr_t)__dest;
}

Assistant:

intptr_t mock_(TestReporter* test_reporter, const char *function, const char *mock_file, int mock_line, const char *parameters, ...) {
    va_list actuals;
    CgreenVector *actual_values;
    CgreenVector *parameter_names;
    int failures_before_read_only_constraints_executed;
    int failures_after_read_only_constraints_executed;
    CgreenValue stored_result;
    RecordedExpectation *expectation = find_expectation(function);

    parameter_names = create_vector_of_names(parameters);

    va_start(actuals, parameters);
    actual_values = create_vector_of_actuals(actuals, number_of_parameters_in(parameters));
    va_end(actuals);

    convert_boxed_doubles_to_cgreen_values(parameters, actual_values);

    if (expectation == NULL) {
        handle_missing_expectation_for(function, mock_file, mock_line, parameter_names, actual_values, test_reporter);
        destroy_cgreen_vector(actual_values);
        destroy_cgreen_vector(parameter_names);
        return 0;
    }

    if (is_never_call(expectation)) {
        expectation->times_triggered++;
        report_violated_never_call(test_reporter, expectation);
        destroy_cgreen_vector(actual_values);
        destroy_cgreen_vector(parameter_names);
        return 0;
    }

    ensure_successfully_mocked_calls_list_exists();
    cgreen_vector_add(successfully_mocked_calls, (void*)function);

    stored_result = stored_result_or_default_for(expectation->constraints);
    // FIXME: Should verify that return value is not a DOUBLE as `mock_()' can not
    // return them. There should also be a 'mock_double_()' which does the same except
    // returning a double.

    // First check all actual constraints for validity...
    for (int i = 0; i < cgreen_vector_size(expectation->constraints); i++) {
        Constraint *constraint = (Constraint *)cgreen_vector_get(expectation->constraints, i);

        if (constraint->type == CGREEN_CALL_COUNTER_CONSTRAINT) {
            expectation->number_times_called++;
            continue;
        }

        if (!is_parameter(constraint))
            continue;

        if (!constraint_is_for_parameter_in(constraint, parameters)) {
            // if expectation parameter name isn't in parameter_names,
            // fail test and skip applying constraints unlikely to match
            report_mock_parameter_name_not_found(test_reporter, expectation, constraint->parameter_name);
            destroy_expectation_if_time_to_die(expectation);
            destroy_cgreen_vector(actual_values);
            destroy_cgreen_vector(parameter_names);

            return stored_result.value.integer_value;
        }
    }

    // Now we can do the read-only constraints.  If read-only
    // constraints aren't matching, content-setting ones might corrupt
    // memory so apply read-only ones first, and if they don't fail,
    // then do the deeper constraints
    failures_before_read_only_constraints_executed = test_reporter->failures;

    for (int i = 0; i < cgreen_vector_size(parameter_names); i++) {
        const char* parameter_name = (const char*)cgreen_vector_get(parameter_names, i);
        CgreenValue actual = *(CgreenValue*)cgreen_vector_get(actual_values, i);
        apply_any_read_only_parameter_constraints(expectation, parameter_name, actual, test_reporter);
    }

    failures_after_read_only_constraints_executed = test_reporter->failures;

    // And now we can do the content setting constraints...
    // FIXME: this comparison doesn't work because only parent
    //        processes' pass/fail counts are updated, and even then
    //        only once they read from the pipe
    if (failures_before_read_only_constraints_executed == failures_after_read_only_constraints_executed) {
        for (int i = 0; i < cgreen_vector_size(parameter_names); i++) {
            const char* parameter_name = (const char*)cgreen_vector_get(parameter_names, i);
            CgreenValue actual = *(CgreenValue*)cgreen_vector_get(actual_values, i);
            apply_any_content_setting_parameter_constraints(expectation, parameter_name, actual, test_reporter);
        }
    }

    // And finally run all side effects
    for (int i = 0; i < cgreen_vector_size(expectation->constraints); i++) {
        Constraint *constraint = (Constraint *)cgreen_vector_get(expectation->constraints, i);

        if (is_side_effect_constraint(constraint)) {
            apply_side_effect(test_reporter, expectation, constraint);
            continue;
        }
    }



    destroy_cgreen_vector(parameter_names);
    destroy_cgreen_vector(actual_values);

    expectation->times_triggered++;
    destroy_expectation_if_time_to_die(expectation);

    if (stored_result.type == CGREEN_DOUBLE) {
#ifdef FUTURE
        /* TODO: for some future version we should ensure that the
           user is not trying to return a double through 'mock()' when
           there is a 'mock_double()' available, which there isn't
           yet. So then

               return unbox_double(mock(...));

           should be replaced by

               return mock_double(...);
        */
        test_reporter->assert_true(test_reporter,
                                   mock_file,
                                   mock_line,
                                   false,
                                   "Mocked function [%s] have a 'will_return_double()' expectation, "
                                   "but 'mock()' cannot return doubles; Use 'mock_double()' instead",
                                   function);
        /* But we'll return it anyway, whatever it becomes is what he will get... */
        return stored_result.value.double_value;
#else
        /* ... but for now return a boxed double since the user is probably using

               return unbox_double(mock(...));

           as is the standard way in 1.x
        */
        return box_double(stored_result.value.double_value);
#endif
    } else
        return stored_result.value.integer_value;
}